

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O2

void __thiscall GetUniquePathTest_Default_Test::TestBody(GetUniquePathTest_Default_Test *this)

{
  char *pcVar1;
  undefined1 local_108 [8];
  WithEnv withTestVar;
  WithEnv withForced;
  AssertionResult gtest_ar_1;
  allocator<char> local_68 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withTestVar.val.field_2._M_local_buf + 8),"GPROF_TEST_PATH",
             (allocator<char> *)&gtest_ar_2.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"/var/log/some_file_name",
             (allocator<char> *)(withForced.val.field_2._M_local_buf + 8));
  WithEnv::WithEnv((WithEnv *)local_108,(string *)((long)&withTestVar.val.field_2 + 8),
                   (string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)(withTestVar.val.field_2._M_local_buf + 8));
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)local_38,"\"/var/log/some_file_name\"","GetTestPath()",
             (char (*) [24])"/var/log/some_file_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withTestVar.val.field_2._M_local_buf + 8));
  if (local_38[0] == (string)0x0) {
    testing::Message::Message((Message *)((long)&withTestVar.val.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_2.message_,(Message *)((long)&withTestVar.val.field_2 + 8))
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    if (withTestVar.val.field_2._8_8_ != 0) {
      (**(code **)(*(long *)withTestVar.val.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"/var/log/some_file_name",local_68);
  AppendPID((string *)((long)&withTestVar.val.field_2 + 8),(string *)local_38);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),
             "AppendPID(\"/var/log/some_file_name\")","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)(withTestVar.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)((long)&withTestVar.val.field_2 + 8));
    if (gtest_ar_1._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x58,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_38,(Message *)((long)&withTestVar.val.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
    if (withTestVar.val.field_2._8_8_ != 0) {
      (**(code **)(*(long *)withTestVar.val.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_1);
  WithEnv::Reset((WithEnv *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"GPROF_TEST_PATH_USE_PID",
             (allocator<char> *)(withForced.val.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_2.message_,"1",local_68);
  WithEnv::WithEnv((WithEnv *)((long)&withTestVar.val.field_2 + 8),(string *)local_38,
                   (string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_2.message_,"/var/log/some_file_name",&local_11);
  AppendPID((string *)local_38,(string *)&gtest_ar_2.message_);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_68,"AppendPID(\"/var/log/some_file_name\")","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withForced.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withForced.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  if (local_68[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x5e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_2.message_,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_2.message_,"/var/log/some_file_name",&local_11);
  AppendPID((string *)local_38,(string *)&gtest_ar_2.message_);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_68,"AppendPID(\"/var/log/some_file_name\")","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withForced.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withForced.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  if (local_68[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x61,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_2.message_,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  WithEnv::~WithEnv((WithEnv *)((long)&withTestVar.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_108);
  return;
}

Assistant:

TEST(GetUniquePathTest, Default) {
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  EXPECT_EQ(TEST_VAL, GetTestPath());

  // Now that we ran GetUniquePathFromEnv once, we can test "child"
  // case, which appends pid
  EXPECT_EQ(AppendPID(TEST_VAL), GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case - must include PID (will set the child flag)
  EXPECT_EQ(AppendPID(TEST_VAL), GetTestPath());

  // Test child case
  EXPECT_EQ(AppendPID(TEST_VAL), GetTestPath());
}